

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_lights.cxx
# Opt level: O0

void __thiscall read_light_v5::operator()(read_light_v5 *this,light_data **_light,xr_reader *r)

{
  light_data *plVar1;
  light_data *light;
  xr_reader *r_local;
  light_data **_light_local;
  read_light_v5 *this_local;
  
  plVar1 = (light_data *)operator_new(0x6c);
  *_light = plVar1;
  xray_re::d3d_light::load(&plVar1->d3d_params,r);
  xray_re::xr_reader::advance(r,0x14);
  if ((plVar1->d3d_params).type == 1) {
    plVar1->controller_id = 2;
  }
  else {
    if ((plVar1->d3d_params).type != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_lights.cxx"
                    ,0x18,"void read_light_v5::operator()(light_data *&, xr_reader &) const");
    }
    plVar1->controller_id = 1;
  }
  return;
}

Assistant:

void operator()(light_data*& _light, xr_reader& r) const {
	light_data* light = new light_data;
	_light = light;
	light->d3d_params.load(r);
	r.advance(sizeof(fsl_light_v5) - sizeof(d3d_light));
	if (light->d3d_params.type == D3D_LIGHT_POINT)
		light->controller_id = 2;
	else if (light->d3d_params.type == D3D_LIGHT_DIRECTIONAL)
		light->controller_id = 1;
	else
		xr_not_expected();
}